

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.cc
# Opt level: O2

bool __thiscall
draco::DirectBitDecoder::StartDecoding(DirectBitDecoder *this,DecoderBuffer *source_buffer)

{
  pointer puVar1;
  bool bVar2;
  ulong in_RAX;
  uint32_t size_in_bytes;
  undefined8 uStack_18;
  
  puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->num_used_bits_ = 0;
  (this->pos_)._M_current = puVar1;
  uStack_18 = in_RAX;
  bVar2 = DecoderBuffer::Decode<unsigned_int>(source_buffer,(uint *)((long)&uStack_18 + 4));
  if (((bVar2) && ((uStack_18 & 0x300000000) == 0 && (ulong)uStack_18._4_4_ != 0)) &&
     ((long)(ulong)uStack_18._4_4_ <= source_buffer->data_size_ - source_buffer->pos_)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->bits_,(ulong)(uStack_18._4_4_ >> 2));
    bVar2 = DecoderBuffer::Decode
                      (source_buffer,
                       (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start,(ulong)uStack_18._4_4_);
    if (bVar2) {
      (this->pos_)._M_current =
           (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      this->num_used_bits_ = 0;
      return true;
    }
  }
  return false;
}

Assistant:

bool DirectBitDecoder::StartDecoding(DecoderBuffer *source_buffer) {
  Clear();
  uint32_t size_in_bytes;
  if (!source_buffer->Decode(&size_in_bytes)) {
    return false;
  }

  // Check that size_in_bytes is > 0 and a multiple of 4 as the encoder always
  // encodes 32 bit elements.
  if (size_in_bytes == 0 || size_in_bytes & 0x3) {
    return false;
  }
  if (size_in_bytes > source_buffer->remaining_size()) {
    return false;
  }
  const uint32_t num_32bit_elements = size_in_bytes / 4;
  bits_.resize(num_32bit_elements);
  if (!source_buffer->Decode(bits_.data(), size_in_bytes)) {
    return false;
  }
  pos_ = bits_.begin();
  num_used_bits_ = 0;
  return true;
}